

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arenastring.cc
# Opt level: O1

void __thiscall
google::protobuf::internal::ArenaStringPtr::Set
          (ArenaStringPtr *this,string *default_value,string *value,Arena *arena)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  string *this_00;
  pointer pcVar2;
  long lVar3;
  long *plVar4;
  
  this_00 = (string *)(this->tagged_ptr_).ptr_;
  if (this_00 != default_value) {
    std::__cxx11::string::operator=((string *)this_00,(string *)value);
    return;
  }
  if (arena == (Arena *)0x0) {
    plVar4 = (long *)operator_new(0x20);
  }
  else {
    if (((byte)arena[0x18] & 1) != 0) {
      Set((ArenaStringPtr *)arena);
    }
    plVar4 = (long *)ArenaImpl::AllocateAlignedAndAddCleanup
                               ((ArenaImpl *)arena,0x20,arena_destruct_object<std::__cxx11::string>)
    ;
  }
  *plVar4 = (long)(plVar4 + 2);
  pcVar2 = (value->_M_dataplus)._M_p;
  paVar1 = &value->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 == paVar1) {
    lVar3 = *(long *)((long)&value->field_2 + 8);
    plVar4[2] = paVar1->_M_allocated_capacity;
    plVar4[3] = lVar3;
  }
  else {
    *plVar4 = (long)pcVar2;
    plVar4[2] = paVar1->_M_allocated_capacity;
  }
  plVar4[1] = value->_M_string_length;
  (value->_M_dataplus)._M_p = (pointer)paVar1;
  value->_M_string_length = 0;
  (value->field_2)._M_local_buf[0] = '\0';
  (this->tagged_ptr_).ptr_ = plVar4;
  return;
}

Assistant:

void ArenaStringPtr::Set(const std::string* default_value, std::string&& value,
                         ::google::protobuf::Arena* arena) {
  if (IsDefault(default_value)) {
    if (arena == nullptr) {
      tagged_ptr_.Set(new std::string(std::move(value)));
    } else {
      tagged_ptr_.Set(Arena::Create<std::string>(arena, std::move(value)));
    }
  } else if (IsDonatedString()) {
    std::string* current = tagged_ptr_.Get();
    auto* s = new (current) std::string(std::move(value));
    arena->OwnDestructor(s);
    tagged_ptr_.Set(s);
  } else /* !IsDonatedString() */ {
    *UnsafeMutablePointer() = std::move(value);
  }
}